

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O2

int chacha20_poly1305_seal_scatter
              (uint8_t *key,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,size_t max_out_tag_len
              ,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,uint8_t *extra_in,
              size_t extra_in_len,uint8_t *ad,size_t ad_len,size_t tag_len)

{
  int iVar1;
  uint counter;
  ulong uVar2;
  size_t done;
  ulong uVar3;
  int line;
  ulong uVar4;
  chacha20_poly1305_seal_data data;
  
  if (CARRY8(tag_len,extra_in_len)) {
    iVar1 = 0x75;
    line = 0x73;
  }
  else if (max_out_tag_len < tag_len + extra_in_len) {
    iVar1 = 0x67;
    line = 0x77;
  }
  else if (nonce_len == 0xc) {
    if (in_len < 0x3fffffffc0) {
      if (extra_in_len != 0) {
        uVar2 = in_len >> 6;
        uVar4 = (ulong)((uint)in_len & 0x3f);
        uVar3 = 0;
        while (uVar3 < extra_in_len) {
          counter = (int)uVar2 + 1;
          uVar2 = (ulong)counter;
          data.in.extra_ciphertext = (uint8_t *)0x0;
          data.in.extra_ciphertext_len = 0;
          data.in.counter = 0;
          data._36_4_ = 0;
          data._40_4_ = 0;
          data._44_4_ = 0;
          data._16_8_ = 0;
          data._24_8_ = 0;
          data._0_8_ = 0;
          data._8_8_ = 0;
          CRYPTO_chacha_20((uint8_t *)&data,(uint8_t *)&data,0x40,key,nonce,counter);
          for (; (uVar4 < 0x40 && (uVar3 < extra_in_len)); uVar3 = uVar3 + 1) {
            out_tag[uVar3] = *(byte *)((long)&data + uVar4) ^ extra_in[uVar3];
            uVar4 = uVar4 + 1;
          }
          uVar4 = 0;
        }
      }
      iVar1 = CRYPTO_is_SSE4_1_capable();
      if (iVar1 == 0) {
        CRYPTO_chacha_20(out,in,in_len,key,nonce,1);
        calc_tag((uint8_t *)&data,key,nonce,ad,ad_len,out,in_len,out_tag,extra_in_len);
      }
      else {
        data._0_8_ = *(undefined8 *)key;
        data._8_8_ = *(undefined8 *)(key + 8);
        data._16_8_ = *(undefined8 *)(key + 0x10);
        data._24_8_ = *(undefined8 *)(key + 0x18);
        data.in.counter = 0;
        data._36_4_ = (undefined4)*(undefined8 *)nonce;
        data._40_4_ = (undefined4)((ulong)*(undefined8 *)nonce >> 0x20);
        data._44_4_ = *(undefined4 *)(nonce + 8);
        data.in.extra_ciphertext_len = extra_in_len;
        data.in.extra_ciphertext = out_tag;
        chacha20_poly1305_seal(out,in,in_len,ad,ad_len,&data);
      }
      if (tag_len != 0) {
        memcpy(out_tag + extra_in_len,&data,tag_len);
      }
      *out_tag_len = tag_len + extra_in_len;
      return 1;
    }
    iVar1 = 0x75;
    line = 0x87;
  }
  else {
    iVar1 = 0x79;
    line = 0x7b;
  }
  ERR_put_error(0x1e,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                ,line);
  return 0;
}

Assistant:

static int chacha20_poly1305_seal_scatter(
    const uint8_t *key, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len, size_t tag_len) {
  if (extra_in_len + tag_len < tag_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }
  if (max_out_tag_len < tag_len + extra_in_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }
  if (nonce_len != 12) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  // |CRYPTO_chacha_20| uses a 32-bit block counter. Therefore we disallow
  // individual operations that work on more than 256GB at a time.
  // |in_len_64| is needed because, on 32-bit platforms, size_t is only
  // 32-bits and this produces a warning because it's always false.
  // Casting to uint64_t inside the conditional is not sufficient to stop
  // the warning.
  const uint64_t in_len_64 = in_len;
  if (in_len_64 >= (UINT64_C(1) << 32) * 64 - 64) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  if (max_out_tag_len < tag_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }

  // The the extra input is given, it is expected to be very short and so is
  // encrypted byte-by-byte first.
  if (extra_in_len) {
    static const size_t kChaChaBlockSize = 64;
    uint32_t block_counter = (uint32_t)(1 + (in_len / kChaChaBlockSize));
    size_t offset = in_len % kChaChaBlockSize;
    uint8_t block[64 /* kChaChaBlockSize */];

    for (size_t done = 0; done < extra_in_len; block_counter++) {
      memset(block, 0, sizeof(block));
      CRYPTO_chacha_20(block, block, sizeof(block), key, nonce,
                       block_counter);
      for (size_t i = offset; i < sizeof(block) && done < extra_in_len;
           i++, done++) {
        out_tag[done] = extra_in[done] ^ block[i];
      }
      offset = 0;
    }
  }

  union chacha20_poly1305_seal_data data;
  if (chacha20_poly1305_asm_capable()) {
    OPENSSL_memcpy(data.in.key, key, 32);
    data.in.counter = 0;
    OPENSSL_memcpy(data.in.nonce, nonce, 12);
    data.in.extra_ciphertext = out_tag;
    data.in.extra_ciphertext_len = extra_in_len;
    chacha20_poly1305_seal(out, in, in_len, ad, ad_len, &data);
  } else {
    CRYPTO_chacha_20(out, in, in_len, key, nonce, 1);
    calc_tag(data.out.tag, key, nonce, ad, ad_len, out, in_len, out_tag,
             extra_in_len);
  }

  OPENSSL_memcpy(out_tag + extra_in_len, data.out.tag, tag_len);
  *out_tag_len = extra_in_len + tag_len;
  return 1;
}